

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
* __thiscall
diligent_spirv_cross::CompilerGLSL::flattened_access_chain_offset_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *__return_storage_ptr__,CompilerGLSL *this,SPIRType *basetype,uint32_t *indices,
          uint32_t count,uint32_t offset,uint32_t word_stride,bool *need_transpose,
          uint32_t *out_matrix_stride,uint32_t *out_array_stride,bool ptr_chain)

{
  ID id;
  Variant *pVVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *ppVar2;
  char cVar3;
  char cVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  SPIRType *type;
  SPIRConstant *pSVar8;
  SPIRType *pSVar9;
  runtime_error *prVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint local_c8;
  uint32_t local_c4;
  uint local_bc;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  Bitset local_98;
  CompilerGLSL *local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_50;
  SPIRType *local_48;
  ulong local_40;
  uint32_t *local_38;
  
  local_48 = basetype;
  local_38 = indices;
  type = Compiler::get_pointee_type(&this->super_Compiler,basetype);
  local_b8 = local_a8;
  local_b0 = 0;
  local_a8[0] = 0;
  local_c4 = 0;
  if (need_transpose == (bool *)0x0) {
    local_c8 = 0;
  }
  else {
    local_c8 = (uint)*need_transpose;
  }
  if (out_matrix_stride != (uint32_t *)0x0) {
    local_c4 = *out_matrix_stride;
  }
  if (out_array_stride == (uint32_t *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *out_array_stride;
  }
  local_bc = offset;
  local_50 = __return_storage_ptr__;
  if (count != 0) {
    local_40 = (ulong)count;
    uVar14 = 0;
    local_58 = this;
    do {
      uVar13 = local_38[uVar14];
      uVar12 = (ulong)uVar13;
      if (uVar14 == 0 && ptr_chain) {
        uVar5 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(local_48->super_IVariant).self.id,ArrayStride)
        ;
        this = local_58;
        if (uVar5 == 0) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar10,"SPIR-V does not define ArrayStride for buffer block.");
          goto LAB_00750d63;
        }
        pSVar9 = type;
        if ((uVar12 < (local_58->super_Compiler).ir.ids.
                      super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
           (pVVar1 = (local_58->super_Compiler).ir.ids.
                     super_VectorView<diligent_spirv_cross::Variant>.ptr,
           pVVar1[uVar12].type == TypeConstant)) {
          pSVar8 = Variant::get<diligent_spirv_cross::SPIRConstant>(pVVar1 + uVar12);
          local_bc = local_bc + (pSVar8->m).c[0].r[0].u32 * uVar5;
        }
        else {
          uVar12 = (ulong)uVar5 / (ulong)word_stride;
          if (uVar5 % word_stride != 0) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (prVar10,
                       "Array stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a float or vec2 array inside a push constant block which is std430. This cannot be flattened. Try using std140 layout instead."
                      );
            *(undefined ***)prVar10 = &PTR__runtime_error_00b5dcd0;
            __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          to_enclosed_expression_abi_cxx11_((string *)&local_98,local_58,uVar13,true);
          ::std::__cxx11::string::_M_append((char *)&local_b8,local_98.lower);
          if ((size_type *)local_98.lower != &local_98.higher._M_h._M_bucket_count) {
            operator_delete((void *)local_98.lower);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
          cVar4 = '\x01';
          uVar13 = (uint)uVar12;
          if (9 < uVar13) {
            cVar3 = '\x04';
            do {
              cVar4 = cVar3;
              uVar11 = (uint)uVar12;
              if (uVar11 < 100) {
                cVar4 = cVar4 + -2;
                goto LAB_0075086e;
              }
              if (uVar11 < 1000) {
                cVar4 = cVar4 + -1;
                goto LAB_0075086e;
              }
              if (uVar11 < 10000) goto LAB_0075086e;
              uVar12 = uVar12 / 10000;
              cVar3 = cVar4 + '\x04';
            } while (99999 < uVar11);
            cVar4 = cVar4 + '\x01';
          }
LAB_0075086e:
          local_98.lower = (uint64_t)&local_98.higher._M_h._M_bucket_count;
          ::std::__cxx11::string::_M_construct((ulong)&local_98,cVar4);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)local_98.lower,(uint)local_98.higher._M_h._M_buckets,uVar13);
          ::std::__cxx11::string::_M_append((char *)&local_b8,local_98.lower);
          if ((size_type *)local_98.lower != &local_98.higher._M_h._M_bucket_count) {
            operator_delete((void *)local_98.lower);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
        }
      }
      else if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
        if (type->basetype == Struct) {
          uVar6 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar13);
          if ((type->member_types).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
              buffer_size <= (ulong)uVar6) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar10,"Member index is out of bounds!");
LAB_00750d63:
            *(undefined ***)prVar10 = &PTR__runtime_error_00b5dcd0;
            __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar7 = Compiler::type_struct_member_offset(&local_58->super_Compiler,type,uVar6);
          pSVar9 = Variant::get<diligent_spirv_cross::SPIRType>
                             ((local_58->super_Compiler).ir.ids.
                              super_VectorView<diligent_spirv_cross::Variant>.ptr +
                              (type->member_types).
                              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                              .ptr[uVar6].id);
          if (pSVar9->columns < 2) {
            local_c8 = 0;
          }
          else {
            local_c4 = Compiler::type_struct_member_matrix_stride
                                 (&local_58->super_Compiler,type,uVar6);
            Compiler::combined_decoration_for_member(&local_98,&local_58->super_Compiler,type,uVar6)
            ;
            local_c8 = (uint)(local_98.lower >> 4) & 0xf;
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_98.higher._M_h);
          }
          local_bc = local_bc + uVar7;
          this = local_58;
          if ((pSVar9->array).super_VectorView<unsigned_int>.buffer_size != 0) {
            uVar5 = Compiler::type_struct_member_array_stride(&local_58->super_Compiler,type,uVar6);
            this = local_58;
          }
        }
        else if (type->columns < 2) {
          if (type->vecsize < 2) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar10,"Cannot subdivide a scalar value!");
            goto LAB_00750d63;
          }
          if ((uVar12 < (this->super_Compiler).ir.ids.
                        super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
             (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>
                       .ptr, pVVar1[uVar12].type == TypeConstant)) {
            Variant::get<diligent_spirv_cross::SPIRConstant>(pVVar1 + uVar12);
            uVar7 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar13);
            uVar6 = local_c4;
            if ((local_c8 & 1) == 0) {
              uVar6 = type->width >> 3;
            }
            local_bc = local_bc + uVar6 * uVar7;
          }
          else {
            uVar6 = local_c4;
            if ((local_c8 & 1) == 0) {
              uVar6 = type->width >> 3;
            }
            uVar12 = (ulong)uVar6 / (ulong)word_stride;
            if (uVar6 % word_stride != 0) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error
                        (prVar10,
                         "Stride for dynamic vector indexing must be divisible by the size of a 4-component vector. This cannot be flattened in legacy targets."
                        );
              *(undefined ***)prVar10 = &PTR__runtime_error_00b5dcd0;
              __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            to_enclosed_expression_abi_cxx11_((string *)&local_98,this,uVar13,false);
            ::std::__cxx11::string::_M_append((char *)&local_b8,local_98.lower);
            if ((size_type *)local_98.lower != &local_98.higher._M_h._M_bucket_count) {
              operator_delete((void *)local_98.lower);
            }
            ::std::__cxx11::string::append((char *)&local_b8);
            cVar4 = '\x01';
            uVar13 = (uint)uVar12;
            if (9 < uVar13) {
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                uVar11 = (uint)uVar12;
                if (uVar11 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_00750c31;
                }
                if (uVar11 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_00750c31;
                }
                if (uVar11 < 10000) goto LAB_00750c31;
                uVar12 = uVar12 / 10000;
                cVar3 = cVar4 + '\x04';
              } while (99999 < uVar11);
              cVar4 = cVar4 + '\x01';
            }
LAB_00750c31:
            local_98.lower = (uint64_t)&local_98.higher._M_h._M_bucket_count;
            ::std::__cxx11::string::_M_construct((ulong)&local_98,cVar4);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_98.lower,(uint)local_98.higher._M_h._M_buckets,uVar13);
            ::std::__cxx11::string::_M_append((char *)&local_b8,local_98.lower);
            if ((size_type *)local_98.lower != &local_98.higher._M_h._M_bucket_count) {
              operator_delete((void *)local_98.lower);
            }
            ::std::__cxx11::string::append((char *)&local_b8);
          }
          pSVar9 = Variant::get<diligent_spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.
                              super_VectorView<diligent_spirv_cross::Variant>.ptr +
                              (type->parent_type).id);
        }
        else {
          if ((uVar12 < (this->super_Compiler).ir.ids.
                        super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
             (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>
                       .ptr, pVVar1[uVar12].type == TypeConstant)) {
            Variant::get<diligent_spirv_cross::SPIRConstant>(pVVar1 + uVar12);
            uVar7 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar13);
            uVar6 = local_c4;
            if ((local_c8 & 1) != 0) {
              uVar6 = type->width >> 3;
            }
            local_bc = local_bc + uVar6 * uVar7;
          }
          else {
            uVar6 = local_c4;
            if ((local_c8 & 1) != 0) {
              uVar6 = type->width >> 3;
            }
            uVar12 = (ulong)uVar6 / (ulong)word_stride;
            if (uVar6 % word_stride != 0) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error
                        (prVar10,
                         "Matrix stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a row-major matrix being accessed dynamically. This cannot be flattened. Try using std140 layout instead."
                        );
              *(undefined ***)prVar10 = &PTR__runtime_error_00b5dcd0;
              __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            to_enclosed_expression_abi_cxx11_((string *)&local_98,this,uVar13,false);
            ::std::__cxx11::string::_M_append((char *)&local_b8,local_98.lower);
            if ((size_type *)local_98.lower != &local_98.higher._M_h._M_bucket_count) {
              operator_delete((void *)local_98.lower);
            }
            ::std::__cxx11::string::append((char *)&local_b8);
            cVar4 = '\x01';
            uVar13 = (uint)uVar12;
            if (9 < uVar13) {
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                uVar11 = (uint)uVar12;
                if (uVar11 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_00750bb3;
                }
                if (uVar11 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_00750bb3;
                }
                if (uVar11 < 10000) goto LAB_00750bb3;
                uVar12 = uVar12 / 10000;
                cVar3 = cVar4 + '\x04';
              } while (99999 < uVar11);
              cVar4 = cVar4 + '\x01';
            }
LAB_00750bb3:
            local_98.lower = (uint64_t)&local_98.higher._M_h._M_bucket_count;
            ::std::__cxx11::string::_M_construct((ulong)&local_98,cVar4);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_98.lower,(uint)local_98.higher._M_h._M_buckets,uVar13);
            ::std::__cxx11::string::_M_append((char *)&local_b8,local_98.lower);
            if ((size_type *)local_98.lower != &local_98.higher._M_h._M_bucket_count) {
              operator_delete((void *)local_98.lower);
            }
            ::std::__cxx11::string::append((char *)&local_b8);
          }
          pSVar9 = Variant::get<diligent_spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.
                              super_VectorView<diligent_spirv_cross::Variant>.ptr +
                              (type->parent_type).id);
        }
      }
      else {
        if ((uVar12 < (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                      buffer_size) &&
           (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                     ptr, pVVar1[uVar12].type == TypeConstant)) {
          pSVar8 = Variant::get<diligent_spirv_cross::SPIRConstant>(pVVar1 + uVar12);
          local_bc = local_bc + (pSVar8->m).c[0].r[0].u32 * uVar5;
        }
        else {
          uVar12 = (ulong)uVar5 / (ulong)word_stride;
          if (uVar5 % word_stride != 0) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (prVar10,
                       "Array stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a float or vec2 array inside a push constant block which is std430. This cannot be flattened. Try using std140 layout instead."
                      );
            *(undefined ***)prVar10 = &PTR__runtime_error_00b5dcd0;
            __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          to_enclosed_expression_abi_cxx11_((string *)&local_98,this,uVar13,false);
          ::std::__cxx11::string::_M_append((char *)&local_b8,local_98.lower);
          if ((size_type *)local_98.lower != &local_98.higher._M_h._M_bucket_count) {
            operator_delete((void *)local_98.lower);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
          cVar4 = '\x01';
          uVar13 = (uint)uVar12;
          if (9 < uVar13) {
            cVar3 = '\x04';
            do {
              cVar4 = cVar3;
              uVar11 = (uint)uVar12;
              if (uVar11 < 100) {
                cVar4 = cVar4 + -2;
                goto LAB_00750b04;
              }
              if (uVar11 < 1000) {
                cVar4 = cVar4 + -1;
                goto LAB_00750b04;
              }
              if (uVar11 < 10000) goto LAB_00750b04;
              uVar12 = uVar12 / 10000;
              cVar3 = cVar4 + '\x04';
            } while (99999 < uVar11);
            cVar4 = cVar4 + '\x01';
          }
LAB_00750b04:
          local_98.lower = (uint64_t)&local_98.higher._M_h._M_bucket_count;
          ::std::__cxx11::string::_M_construct((ulong)&local_98,cVar4);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)local_98.lower,(uint)local_98.higher._M_h._M_buckets,uVar13);
          ::std::__cxx11::string::_M_append((char *)&local_b8,local_98.lower);
          if ((size_type *)local_98.lower != &local_98.higher._M_h._M_bucket_count) {
            operator_delete((void *)local_98.lower);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
        }
        id.id = (type->parent_type).id;
        pSVar9 = Variant::get<diligent_spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.
                            super_VectorView<diligent_spirv_cross::Variant>.ptr + id.id);
        if ((pSVar9->array).super_VectorView<unsigned_int>.buffer_size != 0) {
          uVar5 = Compiler::get_decoration(&this->super_Compiler,id,ArrayStride);
        }
      }
      uVar14 = uVar14 + 1;
      type = pSVar9;
    } while (uVar14 != local_40);
  }
  ppVar2 = local_50;
  if (need_transpose != (bool *)0x0) {
    *need_transpose = (bool)((byte)local_c8 & 1);
  }
  if (out_matrix_stride != (uint32_t *)0x0) {
    *out_matrix_stride = local_c4;
  }
  if (out_array_stride != (uint32_t *)0x0) {
    *out_array_stride = uVar5;
  }
  (local_50->first)._M_dataplus._M_p = (pointer)&(local_50->first).field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_50,local_b8,local_b8 + local_b0);
  ppVar2->second = local_bc;
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  return ppVar2;
}

Assistant:

std::pair<std::string, uint32_t> CompilerGLSL::flattened_access_chain_offset(
    const SPIRType &basetype, const uint32_t *indices, uint32_t count, uint32_t offset, uint32_t word_stride,
    bool *need_transpose, uint32_t *out_matrix_stride, uint32_t *out_array_stride, bool ptr_chain)
{
	// Start traversing type hierarchy at the proper non-pointer types.
	const auto *type = &get_pointee_type(basetype);

	std::string expr;

	// Inherit matrix information in case we are access chaining a vector which might have come from a row major layout.
	bool row_major_matrix_needs_conversion = need_transpose ? *need_transpose : false;
	uint32_t matrix_stride = out_matrix_stride ? *out_matrix_stride : 0;
	uint32_t array_stride = out_array_stride ? *out_array_stride : 0;

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		// Pointers
		if (ptr_chain && i == 0)
		{
			// Here, the pointer type will be decorated with an array stride.
			array_stride = get_decoration(basetype.self, DecorationArrayStride);
			if (!array_stride)
				SPIRV_CROSS_THROW("SPIR-V does not define ArrayStride for buffer block.");

			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				// Constant array access.
				offset += constant->scalar() * array_stride;
			}
			else
			{
				// Dynamic array access.
				if (array_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Array stride for dynamic indexing must be divisible by the size "
					                  "of a 4-component vector. "
					                  "Likely culprit here is a float or vec2 array inside a push "
					                  "constant block which is std430. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index);
				expr += " * ";
				expr += convert_to_string(array_stride / word_stride);
				expr += " + ";
			}
		}
		// Arrays
		else if (!type->array.empty())
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				// Constant array access.
				offset += constant->scalar() * array_stride;
			}
			else
			{
				// Dynamic array access.
				if (array_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Array stride for dynamic indexing must be divisible by the size "
					                  "of a 4-component vector. "
					                  "Likely culprit here is a float or vec2 array inside a push "
					                  "constant block which is std430. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(array_stride / word_stride);
				expr += " + ";
			}

			uint32_t parent_type = type->parent_type;
			type = &get<SPIRType>(parent_type);

			if (!type->array.empty())
				array_stride = get_decoration(parent_type, DecorationArrayStride);
		}
		// For structs, the index refers to a constant, which indexes into the members.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			index = evaluate_constant_u32(index);

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			offset += type_struct_member_offset(*type, index);

			auto &struct_type = *type;
			type = &get<SPIRType>(type->member_types[index]);

			if (type->columns > 1)
			{
				matrix_stride = type_struct_member_matrix_stride(struct_type, index);
				row_major_matrix_needs_conversion =
				    combined_decoration_for_member(struct_type, index).get(DecorationRowMajor);
			}
			else
				row_major_matrix_needs_conversion = false;

			if (!type->array.empty())
				array_stride = type_struct_member_array_stride(struct_type, index);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				index = evaluate_constant_u32(index);
				offset += index * (row_major_matrix_needs_conversion ? (type->width / 8) : matrix_stride);
			}
			else
			{
				uint32_t indexing_stride = row_major_matrix_needs_conversion ? (type->width / 8) : matrix_stride;
				// Dynamic array access.
				if (indexing_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Matrix stride for dynamic indexing must be divisible by the size of a "
					                  "4-component vector. "
					                  "Likely culprit here is a row-major matrix being accessed dynamically. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(indexing_stride / word_stride);
				expr += " + ";
			}

			type = &get<SPIRType>(type->parent_type);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				index = evaluate_constant_u32(index);
				offset += index * (row_major_matrix_needs_conversion ? matrix_stride : (type->width / 8));
			}
			else
			{
				uint32_t indexing_stride = row_major_matrix_needs_conversion ? matrix_stride : (type->width / 8);

				// Dynamic array access.
				if (indexing_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Stride for dynamic vector indexing must be divisible by the "
					                  "size of a 4-component vector. "
					                  "This cannot be flattened in legacy targets.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(indexing_stride / word_stride);
				expr += " + ";
			}

			type = &get<SPIRType>(type->parent_type);
		}
		else
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (need_transpose)
		*need_transpose = row_major_matrix_needs_conversion;
	if (out_matrix_stride)
		*out_matrix_stride = matrix_stride;
	if (out_array_stride)
		*out_array_stride = array_stride;

	return std::make_pair(expr, offset);
}